

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O1

ScalarFunctionSet * duckdb::TimeBucketFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *this;
  BaseScalarFunction *pBVar1;
  ScalarFunctionSet *in_RDI;
  long lVar2;
  ScalarFunction *func;
  BaseScalarFunction *function;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  initializer_list<duckdb::LogicalType> __l_04;
  allocator_type local_a99;
  ScalarFunctionSet *local_a98;
  LogicalType local_a90 [24];
  LogicalType local_a78 [24];
  LogicalType local_a60 [24];
  code *local_a48;
  undefined8 uStack_a40;
  code *local_a38;
  code *pcStack_a30;
  code *local_a28;
  undefined8 uStack_a20;
  code *local_a18;
  code *pcStack_a10;
  code *local_a08;
  undefined8 uStack_a00;
  code *local_9f8;
  code *pcStack_9f0;
  code *local_9e8;
  undefined8 uStack_9e0;
  code *local_9d8;
  code *pcStack_9d0;
  code *local_9c8;
  undefined8 uStack_9c0;
  code *local_9b8;
  code *pcStack_9b0;
  code *local_9a8;
  undefined8 uStack_9a0;
  code *local_998;
  code *pcStack_990;
  LogicalType local_980 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_968;
  LogicalType local_950 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_938;
  LogicalType local_920 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_908;
  LogicalType local_8f0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_8d8;
  LogicalType local_8c0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_8a8;
  LogicalType local_890 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_878;
  LogicalType local_860 [24];
  LogicalType local_848 [24];
  LogicalType local_830 [24];
  LogicalType local_818 [24];
  LogicalType local_800 [24];
  LogicalType local_7e8 [24];
  ScalarFunction local_7d0;
  ScalarFunction local_6a8;
  ScalarFunction local_580;
  ScalarFunction local_458;
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0 [176];
  
  local_a98 = in_RDI;
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  duckdb::LogicalType::LogicalType(local_a90,INTERVAL);
  duckdb::LogicalType::LogicalType(local_a78,DATE);
  __l._M_len = 2;
  __l._M_array = local_a90;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_878,__l,&local_a99);
  duckdb::LogicalType::LogicalType(local_890,DATE);
  uStack_9a0 = 0;
  local_9a8 = TimeBucketFunction<duckdb::date_t>;
  pcStack_990 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_998 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_7e8,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_208,&local_878,local_890,&local_9a8,0,0,0,0,local_7e8,0,0,0);
  this = (vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
         (local_a98 + 0x20);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_208);
  local_208._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_208.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_208.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_208.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_208 + 0xb0U),(_Any_data *)((long)&local_208 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_208.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_7e8);
  if (local_998 != (code *)0x0) {
    (*local_998)(&local_9a8,&local_9a8,3);
  }
  duckdb::LogicalType::~LogicalType(local_890);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_878);
  lVar2 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_a90 + lVar2);
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  duckdb::LogicalType::LogicalType(local_a90,INTERVAL);
  duckdb::LogicalType::LogicalType(local_a78,TIMESTAMP);
  __l_00._M_len = 2;
  __l_00._M_array = local_a90;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_8a8,__l_00,&local_a99);
  duckdb::LogicalType::LogicalType(local_8c0,TIMESTAMP);
  uStack_9c0 = 0;
  local_9c8 = TimeBucketFunction<duckdb::timestamp_t>;
  pcStack_9b0 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_9b8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_800,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_330,&local_8a8,local_8c0,&local_9c8,0,0,0,0,local_800,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_330);
  local_330._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_330.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_330.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_330.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_330 + 0xb0U),(_Any_data *)((long)&local_330 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_330.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_800);
  if (local_9b8 != (code *)0x0) {
    (*local_9b8)(&local_9c8,&local_9c8,3);
  }
  duckdb::LogicalType::~LogicalType(local_8c0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_8a8);
  lVar2 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_a90 + lVar2);
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  duckdb::LogicalType::LogicalType(local_a90,INTERVAL);
  duckdb::LogicalType::LogicalType(local_a78,DATE);
  duckdb::LogicalType::LogicalType(local_a60,INTERVAL);
  __l_01._M_len = 3;
  __l_01._M_array = local_a90;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_8d8,__l_01,&local_a99);
  duckdb::LogicalType::LogicalType(local_8f0,DATE);
  uStack_9e0 = 0;
  local_9e8 = TimeBucketOffsetFunction<duckdb::date_t>;
  pcStack_9d0 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_9d8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_818,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_458,&local_8d8,local_8f0,&local_9e8,0,0,0,0,local_818,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_458);
  local_458._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_458.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_458.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_458.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_458.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_458 + 0xb0U),(_Any_data *)((long)&local_458 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_458.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_818);
  if (local_9d8 != (code *)0x0) {
    (*local_9d8)(&local_9e8,&local_9e8,3);
  }
  duckdb::LogicalType::~LogicalType(local_8f0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_8d8);
  lVar2 = 0x30;
  do {
    duckdb::LogicalType::~LogicalType(local_a90 + lVar2);
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  duckdb::LogicalType::LogicalType(local_a90,INTERVAL);
  duckdb::LogicalType::LogicalType(local_a78,TIMESTAMP);
  duckdb::LogicalType::LogicalType(local_a60,INTERVAL);
  __l_02._M_len = 3;
  __l_02._M_array = local_a90;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_908,__l_02,&local_a99);
  duckdb::LogicalType::LogicalType(local_920,TIMESTAMP);
  uStack_a00 = 0;
  local_a08 = TimeBucketOffsetFunction<duckdb::timestamp_t>;
  pcStack_9f0 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_9f8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_830,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_580,&local_908,local_920,&local_a08,0,0,0,0,local_830,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_580);
  local_580._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_580.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_580.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_580.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_580.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_580 + 0xb0U),(_Any_data *)((long)&local_580 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_580.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_830);
  if (local_9f8 != (code *)0x0) {
    (*local_9f8)(&local_a08,&local_a08,3);
  }
  duckdb::LogicalType::~LogicalType(local_920);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_908);
  lVar2 = 0x30;
  do {
    duckdb::LogicalType::~LogicalType(local_a90 + lVar2);
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  duckdb::LogicalType::LogicalType(local_a90,INTERVAL);
  duckdb::LogicalType::LogicalType(local_a78,DATE);
  duckdb::LogicalType::LogicalType(local_a60,DATE);
  __l_03._M_len = 3;
  __l_03._M_array = local_a90;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_938,__l_03,&local_a99);
  duckdb::LogicalType::LogicalType(local_950,DATE);
  uStack_a20 = 0;
  local_a28 = TimeBucketOriginFunction<duckdb::date_t>;
  pcStack_a10 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_a18 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_848,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_6a8,&local_938,local_950,&local_a28,0,0,0,0,local_848,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_6a8);
  local_6a8._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_6a8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_6a8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_6a8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_6a8.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_6a8 + 0xb0U),(_Any_data *)((long)&local_6a8 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_6a8.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_848);
  if (local_a18 != (code *)0x0) {
    (*local_a18)(&local_a28,&local_a28,3);
  }
  duckdb::LogicalType::~LogicalType(local_950);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_938);
  lVar2 = 0x30;
  do {
    duckdb::LogicalType::~LogicalType(local_a90 + lVar2);
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  duckdb::LogicalType::LogicalType(local_a90,INTERVAL);
  duckdb::LogicalType::LogicalType(local_a78,TIMESTAMP);
  duckdb::LogicalType::LogicalType(local_a60,TIMESTAMP);
  __l_04._M_len = 3;
  __l_04._M_array = local_a90;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_968,__l_04,&local_a99);
  duckdb::LogicalType::LogicalType(local_980,TIMESTAMP);
  uStack_a40 = 0;
  local_a48 = TimeBucketOriginFunction<duckdb::timestamp_t>;
  pcStack_a30 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_a38 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_860,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_7d0,&local_968,local_980,&local_a48,0,0,0,0,local_860,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_7d0);
  local_7d0._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_7d0.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7d0.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_7d0.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_7d0.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_7d0 + 0xb0U),(_Any_data *)((long)&local_7d0 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_7d0.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_860);
  if (local_a38 != (code *)0x0) {
    (*local_a38)(&local_a48,&local_a48,3);
  }
  duckdb::LogicalType::~LogicalType(local_980);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_968);
  lVar2 = 0x30;
  do {
    duckdb::LogicalType::~LogicalType(local_a90 + lVar2);
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  function = *(BaseScalarFunction **)(local_a98 + 0x20);
  pBVar1 = *(BaseScalarFunction **)(local_a98 + 0x28);
  if (function != pBVar1) {
    do {
      BaseScalarFunction::SetReturnsError(local_e0,function);
      duckdb::BaseScalarFunction::~BaseScalarFunction(local_e0);
      function = function + 0x128;
    } while (function != pBVar1);
  }
  return local_a98;
}

Assistant:

ScalarFunctionSet TimeBucketFun::GetFunctions() {
	ScalarFunctionSet time_bucket;
	time_bucket.AddFunction(
	    ScalarFunction({LogicalType::INTERVAL, LogicalType::DATE}, LogicalType::DATE, TimeBucketFunction<date_t>));
	time_bucket.AddFunction(ScalarFunction({LogicalType::INTERVAL, LogicalType::TIMESTAMP}, LogicalType::TIMESTAMP,
	                                       TimeBucketFunction<timestamp_t>));
	time_bucket.AddFunction(ScalarFunction({LogicalType::INTERVAL, LogicalType::DATE, LogicalType::INTERVAL},
	                                       LogicalType::DATE, TimeBucketOffsetFunction<date_t>));
	time_bucket.AddFunction(ScalarFunction({LogicalType::INTERVAL, LogicalType::TIMESTAMP, LogicalType::INTERVAL},
	                                       LogicalType::TIMESTAMP, TimeBucketOffsetFunction<timestamp_t>));
	time_bucket.AddFunction(ScalarFunction({LogicalType::INTERVAL, LogicalType::DATE, LogicalType::DATE},
	                                       LogicalType::DATE, TimeBucketOriginFunction<date_t>));
	time_bucket.AddFunction(ScalarFunction({LogicalType::INTERVAL, LogicalType::TIMESTAMP, LogicalType::TIMESTAMP},
	                                       LogicalType::TIMESTAMP, TimeBucketOriginFunction<timestamp_t>));
	for (auto &func : time_bucket.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return time_bucket;
}